

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.h
# Opt level: O2

Var __thiscall
Js::TypedArray<unsigned_int,_false,_false>::BaseTypedDirectGetItem
          (TypedArray<unsigned_int,_false,_false> *this,uint32 index)

{
  uint uVar1;
  ArrayBufferBase *pAVar2;
  code *pcVar3;
  bool bVar4;
  uint uVar5;
  undefined4 *puVar6;
  Var pvVar7;
  
  pAVar2 = (this->super_TypedArrayBase).super_ArrayBufferParent.arrayBuffer.ptr;
  if (pAVar2->isDetached == true) {
    JavascriptError::ThrowTypeError
              ((((((this->super_TypedArrayBase).super_ArrayBufferParent.super_ArrayObject.
                   super_DynamicObject.super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
               super_JavascriptLibraryBase).scriptContext.ptr,-0x7ff5ebe5,(PCWSTR)0x0);
  }
  if (index < (this->super_TypedArrayBase).super_ArrayBufferParent.super_ArrayObject.length) {
    uVar1 = (this->super_TypedArrayBase).byteOffset;
    uVar5 = (*(pAVar2->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x71])();
    if ((ulong)uVar5 < (ulong)uVar1 + (ulong)index * 4 + 4) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/TypedArray.h"
                                  ,0x129,
                                  "((index + 1)* sizeof(TypeName)+GetByteOffset() <= GetArrayBuffer()->GetByteLength())"
                                  ,
                                  "(index + 1)* sizeof(TypeName)+GetByteOffset() <= GetArrayBuffer()->GetByteLength()"
                                 );
      if (!bVar4) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar6 = 0;
    }
    pvVar7 = JavascriptNumber::ToVar
                       (*(uint32 *)((this->super_TypedArrayBase).buffer + (ulong)index * 4),
                        (((((this->super_TypedArrayBase).super_ArrayBufferParent.super_ArrayObject.
                            super_DynamicObject.super_RecyclableObject.type.ptr)->javascriptLibrary)
                         .ptr)->super_JavascriptLibraryBase).scriptContext.ptr);
    return pvVar7;
  }
  return (((((this->super_TypedArrayBase).super_ArrayBufferParent.super_ArrayObject.
             super_DynamicObject.super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
         super_JavascriptLibraryBase).undefinedValue.ptr;
}

Assistant:

inline Var BaseTypedDirectGetItem(__in uint32 index)
        {
            if (this->IsDetachedBuffer()) // 9.4.5.8 IntegerIndexedElementGet
            {
                JavascriptError::ThrowTypeError(GetScriptContext(), JSERR_DetachedTypedArray);
            }

            if (index < GetLength())
            {
                Assert((index + 1)* sizeof(TypeName)+GetByteOffset() <= GetArrayBuffer()->GetByteLength());
                TypeName* typedBuffer = (TypeName*)buffer;
                return JavascriptNumber::ToVar(typedBuffer[index], GetScriptContext());
            }
            return GetLibrary()->GetUndefined();
        }